

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ArrayFeatureType::clear_defaultOptionalValue(ArrayFeatureType *this)

{
  ArrayFeatureType *this_local;
  
  defaultOptionalValue_case(this);
  this->_oneof_case_[1] = 0;
  return;
}

Assistant:

void ArrayFeatureType::clear_defaultOptionalValue() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.ArrayFeatureType)
  switch (defaultOptionalValue_case()) {
    case kIntDefaultValue: {
      // No need to clear
      break;
    }
    case kFloatDefaultValue: {
      // No need to clear
      break;
    }
    case kDoubleDefaultValue: {
      // No need to clear
      break;
    }
    case DEFAULTOPTIONALVALUE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[1] = DEFAULTOPTIONALVALUE_NOT_SET;
}